

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<spvc_entry_point,_8UL> * __thiscall
spirv_cross::SmallVector<spvc_entry_point,_8UL>::operator=
          (SmallVector<spvc_entry_point,_8UL> *this,SmallVector<spvc_entry_point,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  spvc_entry_point *__ptr;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  (this->super_VectorView<spvc_entry_point>).buffer_size = 0;
  if ((other->super_VectorView<spvc_entry_point>).ptr == (spvc_entry_point *)&other->stack_storage)
  {
    reserve(this,(other->super_VectorView<spvc_entry_point>).buffer_size);
    uVar6 = (other->super_VectorView<spvc_entry_point>).buffer_size;
    if (uVar6 != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)&((other->super_VectorView<spvc_entry_point>).ptr)->execution_model + lVar4)
        ;
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)&((this->super_VectorView<spvc_entry_point>).ptr)->execution_model + lVar4);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        uVar5 = uVar5 + 1;
        uVar6 = (other->super_VectorView<spvc_entry_point>).buffer_size;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < uVar6);
    }
    (this->super_VectorView<spvc_entry_point>).buffer_size = uVar6;
    (other->super_VectorView<spvc_entry_point>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<spvc_entry_point>).ptr;
    if (__ptr != (spvc_entry_point *)&this->stack_storage) {
      free(__ptr);
    }
    (this->super_VectorView<spvc_entry_point>).ptr = (other->super_VectorView<spvc_entry_point>).ptr
    ;
    (this->super_VectorView<spvc_entry_point>).buffer_size =
         (other->super_VectorView<spvc_entry_point>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<spvc_entry_point>).ptr = (spvc_entry_point *)0x0;
    (other->super_VectorView<spvc_entry_point>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}